

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O1

void __thiscall
btQuantizedBvh::reportAabbOverlappingNodex
          (btQuantizedBvh *this,btNodeOverlapCallback *nodeCallback,btVector3 *aabbMin,
          btVector3 *aabbMax)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  btTraversalMode bVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint local_10;
  ushort local_c;
  uint local_8;
  ushort local_4;
  
  if (this->m_useQuantization == true) {
    fVar1 = (this->m_bvhAabbMin).m_floats[2];
    fVar2 = fVar1;
    if (fVar1 <= aabbMin->m_floats[2]) {
      fVar2 = aabbMin->m_floats[2];
    }
    fVar8 = (this->m_bvhAabbMax).m_floats[2];
    fVar7 = fVar8;
    if (fVar2 <= fVar8) {
      fVar7 = fVar2;
    }
    fVar2 = (this->m_bvhQuantization).m_floats[2];
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *(ulong *)aabbMin->m_floats;
    uVar3 = *(ulong *)(this->m_bvhAabbMin).m_floats;
    fVar12 = (float)(uVar3 >> 0x20);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar3;
    auVar16 = maxps(auVar15,auVar16);
    uVar4 = *(ulong *)(this->m_bvhAabbMax).m_floats;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar4;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar4;
    auVar16 = minps(auVar18,auVar16);
    uVar5 = *(undefined8 *)(this->m_bvhQuantization).m_floats;
    fVar14 = (float)uVar5;
    fVar17 = (float)((ulong)uVar5 >> 0x20);
    auVar19._0_4_ = (int)((auVar16._0_4_ - (float)uVar3) * fVar14);
    auVar19._4_4_ = (int)((auVar16._4_4_ - fVar12) * fVar17);
    auVar19._8_4_ = (int)((auVar16._8_4_ - 0.0) * 0.0);
    auVar19._12_4_ = (int)((auVar16._12_4_ - 0.0) * 0.0);
    auVar16 = pshuflw(auVar19,auVar19,0xe8);
    local_8 = auVar16._0_4_ & (uint)DAT_001f5d70;
    local_4 = (ushort)(int)((fVar7 - fVar1) * fVar2) & 0xfffe;
    fVar7 = fVar1;
    if (fVar1 <= aabbMax->m_floats[2]) {
      fVar7 = aabbMax->m_floats[2];
    }
    if (fVar7 <= fVar8) {
      fVar8 = fVar7;
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)aabbMax->m_floats;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar3;
    auVar16 = maxps(auVar13,auVar9);
    auVar16 = minps(auVar11,auVar16);
    auVar10._0_4_ = (int)((auVar16._0_4_ - (float)uVar3) * fVar14 + 1.0);
    auVar10._4_4_ = (int)((auVar16._4_4_ - fVar12) * fVar17 + 1.0);
    auVar10._8_4_ = (int)((auVar16._8_4_ - 0.0) * 0.0 + 0.0);
    auVar10._12_4_ = (int)((auVar16._12_4_ - 0.0) * 0.0 + 0.0);
    auVar16 = pshuflw(auVar10,auVar10,0xe8);
    local_10 = auVar16._0_4_ | (uint)DAT_001f59d0;
    local_c = (ushort)(int)((fVar8 - fVar1) * fVar2 + 1.0) | 1;
    bVar6 = this->m_traversalMode;
    if (bVar6 == TRAVERSAL_RECURSIVE) {
      walkRecursiveQuantizedTreeAgainstQueryAabb
                (this,(this->m_quantizedContiguousNodes).m_data,nodeCallback,
                 (unsigned_short *)&local_8,(unsigned_short *)&local_10);
    }
    else if (bVar6 == TRAVERSAL_STACKLESS_CACHE_FRIENDLY) {
      walkStacklessQuantizedTreeCacheFriendly
                (this,nodeCallback,(unsigned_short *)&local_8,(unsigned_short *)&local_10);
    }
    else if (bVar6 == TRAVERSAL_STACKLESS) {
      walkStacklessQuantizedTree
                (this,nodeCallback,(unsigned_short *)&local_8,(unsigned_short *)&local_10,0,
                 this->m_curNodeIndex);
    }
    return;
  }
  walkStacklessTree(this,nodeCallback,aabbMin,aabbMax);
  return;
}

Assistant:

void	btQuantizedBvh::reportAabbOverlappingNodex(btNodeOverlapCallback* nodeCallback,const btVector3& aabbMin,const btVector3& aabbMax) const
{
	//either choose recursive traversal (walkTree) or stackless (walkStacklessTree)

	if (m_useQuantization)
	{
		///quantize query AABB
		unsigned short int quantizedQueryAabbMin[3];
		unsigned short int quantizedQueryAabbMax[3];
		quantizeWithClamp(quantizedQueryAabbMin,aabbMin,0);
		quantizeWithClamp(quantizedQueryAabbMax,aabbMax,1);

		switch (m_traversalMode)
		{
		case TRAVERSAL_STACKLESS:
				walkStacklessQuantizedTree(nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax,0,m_curNodeIndex);
			break;
		case TRAVERSAL_STACKLESS_CACHE_FRIENDLY:
				walkStacklessQuantizedTreeCacheFriendly(nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);
			break;
		case TRAVERSAL_RECURSIVE:
			{
				const btQuantizedBvhNode* rootNode = &m_quantizedContiguousNodes[0];
				walkRecursiveQuantizedTreeAgainstQueryAabb(rootNode,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);
			}
			break;
		default:
			//unsupported
			btAssert(0);
		}
	} else
	{
		walkStacklessTree(nodeCallback,aabbMin,aabbMax);
	}
}